

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_numbers.c
# Opt level: O2

FIOBJ fiobj_float_tmp(double num)

{
  long *in_FS_OFFSET;
  
  *(undefined1 *)(in_FS_OFFSET + -0x4e) = 0x27;
  *(undefined4 *)((long)in_FS_OFFSET + -0x26c) = 0xfffffff;
  in_FS_OFFSET[-0x4d] = (long)num;
  return *in_FS_OFFSET - 0x270;
}

Assistant:

FIOBJ fiobj_float_tmp(double num) {
  static __thread fiobj_float_s ret;
  ret = (fiobj_float_s){
      .head =
          {
              .type = FIOBJ_T_FLOAT,
              .ref = ((~(uint32_t)0) >> 4),
          },
      .f = num,
  };
  return (FIOBJ)&ret;
}